

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void on_loss_detected(quicly_loss_t *loss,quicly_sent_packet_t *lost_packet,int is_time_threshold)

{
  int iVar1;
  st_quicly_conn_t *arg3;
  uint32_t in_EDX;
  st_quicly_conn_t *in_RSI;
  long in_RDI;
  uint uVar2;
  st_quicly_conn_t *unaff_retaddr;
  quicly_conn_t *_conn_2;
  quicly_conn_t *_conn_1;
  quicly_conn_t *_conn;
  quicly_conn_t *conn;
  undefined4 in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffc8;
  st_quicly_conn_t *arg2;
  st_quicly_conn_t *in_stack_ffffffffffffffd0;
  st_quicly_conn_t *arg0;
  st_quicly_conn_t *arg0_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  arg3 = (st_quicly_conn_t *)(in_RDI + -0x5c0);
  *(long *)(in_RDI + -0x268) = *(long *)(in_RDI + -0x268) + 1;
  if (in_EDX != 0) {
    *(long *)(in_RDI + -0x260) = *(long *)(in_RDI + -0x260) + 1;
  }
  uVar2 = (uint)*(ushort *)(in_RDI + 0xa8);
  (**(code **)(*(long *)(in_RDI + 0x178) + 0x18))
            (in_RDI + 0x178,in_RDI,
             *(undefined2 *)((long)&(in_RSI->super).local.cid_set.plaintext.master_id + 2),
             (in_RSI->super).ctx,*(undefined8 *)(in_RDI + 0x98),*(undefined8 *)(in_RDI + 0x400));
  arg0 = arg3;
  if (quicly_trace_fp != (FILE *)0x0) {
    iVar1 = ptls_skip_tracing((arg3->crypto).tls);
    if (iVar1 == 0) {
      QUICLY_PACKET_LOST(arg0,(int64_t)arg3,(uint64_t)in_stack_ffffffffffffffd0,
                         (uint8_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
    }
  }
  QUICLY_TRACER_PACKET_LOST
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (uint8_t)((uint)in_stack_ffffffffffffffbc >> 0x18));
  arg2 = arg0;
  if (quicly_trace_fp != (FILE *)0x0) {
    iVar1 = ptls_skip_tracing((arg0->crypto).tls);
    if (iVar1 == 0) {
      QUICLY_CC_CONGESTION
                (in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(uint64_t)arg2,(size_t)arg3,
                 (uint32_t)((ulong)arg0 >> 0x20));
    }
  }
  QUICLY_TRACER_CC_CONGESTION
            (arg0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             CONCAT44(in_stack_ffffffffffffffbc,uVar2),0);
  arg0_00 = arg2;
  if (quicly_trace_fp != (FILE *)0x0) {
    iVar1 = ptls_skip_tracing((arg2->crypto).tls);
    if (iVar1 == 0) {
      QUICLY_QUICTRACE_CC_LOST(unaff_retaddr,in_RDI,(quicly_rtt_t *)in_RSI,in_EDX,(size_t)arg0_00);
    }
  }
  QUICLY_TRACER_QUICTRACE_CC_LOST
            (arg0_00,(int64_t)arg3,(quicly_rtt_t *)arg0,(uint32_t)((ulong)arg2 >> 0x20),
             in_stack_ffffffffffffffc0);
  return;
}

Assistant:

static void on_loss_detected(quicly_loss_t *loss, const quicly_sent_packet_t *lost_packet, int is_time_threshold)
{
    quicly_conn_t *conn = (void *)((char *)loss - offsetof(quicly_conn_t, egress.loss));

    ++conn->super.stats.num_packets.lost;
    if (is_time_threshold)
        ++conn->super.stats.num_packets.lost_time_threshold;
    conn->egress.cc.type->cc_on_lost(&conn->egress.cc, &conn->egress.loss, lost_packet->cc_bytes_in_flight,
                                     lost_packet->packet_number, conn->egress.packet_number, conn->stash.now,
                                     conn->egress.max_udp_payload_size);
    QUICLY_PROBE(PACKET_LOST, conn, conn->stash.now, lost_packet->packet_number, lost_packet->ack_epoch);
    QUICLY_PROBE(CC_CONGESTION, conn, conn->stash.now, lost_packet->packet_number + 1, conn->egress.loss.sentmap.bytes_in_flight,
                 conn->egress.cc.cwnd);
    QUICLY_PROBE(QUICTRACE_CC_LOST, conn, conn->stash.now, &conn->egress.loss.rtt, conn->egress.cc.cwnd,
                 conn->egress.loss.sentmap.bytes_in_flight);
}